

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-select.c
# Opt level: O0

ssh_hash * sha1_select(ssh_hashalg *alg)

{
  ssh_hashalg *alg_00;
  _Bool _Var1;
  ssh_hash *psVar2;
  sha1_extra *alg_extra;
  ssh_hashalg *alg_1;
  size_t i;
  ssh_hashalg *alg_local;
  
  alg_1 = (ssh_hashalg *)0x0;
  while( true ) {
    if (sha1_select::real_algs[(long)alg_1] == (ssh_hashalg *)0x0) {
      __assert_fail("false && \"sha1_select ran off the end of its list\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha1-select.c"
                    ,0x24,"ssh_hash *sha1_select(const ssh_hashalg *)");
    }
    alg_00 = sha1_select::real_algs[(long)alg_1];
    _Var1 = check_availability((sha1_extra *)alg_00->extra);
    if (_Var1) break;
    alg_1 = (ssh_hashalg *)((long)&alg_1->new + 1);
  }
  psVar2 = ssh_hash_new(alg_00);
  return psVar2;
}

Assistant:

static ssh_hash *sha1_select(const ssh_hashalg *alg)
{
    static const ssh_hashalg *const real_algs[] = {
#if HAVE_SHA_NI
        &ssh_sha1_ni,
#endif
#if HAVE_NEON_CRYPTO
        &ssh_sha1_neon,
#endif
        &ssh_sha1_sw,
        NULL,
    };

    for (size_t i = 0; real_algs[i]; i++) {
        const ssh_hashalg *alg = real_algs[i];
        const struct sha1_extra *alg_extra =
            (const struct sha1_extra *)alg->extra;
        if (check_availability(alg_extra))
            return ssh_hash_new(alg);
    }

    /* We should never reach the NULL at the end of the list, because
     * the last non-NULL entry should be software-only SHA-1, which
     * is always available. */
    unreachable("sha1_select ran off the end of its list");
}